

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# laszip.cpp
# Opt level: O0

bool __thiscall LASzip::unpack(LASzip *this,U8 *bytes,I32 num)

{
  undefined1 auVar1 [16];
  bool bVar2;
  ulong uVar3;
  LASitem *pLVar4;
  ushort *local_30;
  U8 *b;
  U16 i;
  I32 num_local;
  U8 *bytes_local;
  LASzip *this_local;
  
  if (num < 0x22) {
    this_local._7_1_ = return_error(this,"too few bytes to unpack");
  }
  else if ((num + -0x22) % 6 == 0) {
    if ((num + -0x22) / 6 == 0) {
      this_local._7_1_ = return_error(this,"zero items to unpack");
    }
    else {
      this->num_items = (unsigned_short)((num + -0x22) / 6);
      if ((this->items != (LASitem *)0x0) && (this->items != (LASitem *)0x0)) {
        operator_delete__(this->items);
      }
      auVar1 = ZEXT216(this->num_items) * ZEXT816(8);
      uVar3 = auVar1._0_8_;
      if (auVar1._8_8_ != 0) {
        uVar3 = 0xffffffffffffffff;
      }
      pLVar4 = (LASitem *)operator_new__(uVar3);
      this->items = pLVar4;
      this->compressor = *(unsigned_short *)bytes;
      this->coder = *(unsigned_short *)(bytes + 2);
      this->version_major = bytes[4];
      this->version_minor = bytes[5];
      this->version_revision = *(unsigned_short *)(bytes + 6);
      this->options = *(uint *)(bytes + 8);
      this->chunk_size = *(uint *)(bytes + 0xc);
      this->number_of_special_evlrs = *(SIGNED_INT64 *)(bytes + 0x10);
      this->offset_to_special_evlrs = *(SIGNED_INT64 *)(bytes + 0x18);
      this->num_items = *(unsigned_short *)(bytes + 0x20);
      local_30 = (ushort *)(bytes + 0x22);
      for (b._2_2_ = 0; b._2_2_ < this->num_items; b._2_2_ = b._2_2_ + 1) {
        this->items[b._2_2_].type = (uint)*local_30;
        this->items[b._2_2_].size = local_30[1];
        this->items[b._2_2_].version = local_30[2];
        local_30 = local_30 + 3;
      }
      if ((ushort *)(bytes + num) != local_30) {
        __assert_fail("(bytes + num) == b",
                      "/workspace/llm4binary/github/license_c_cmakelists/LASzip[P]LASzip/src/laszip.cpp"
                      ,0x7f,"bool LASzip::unpack(const U8 *, const I32)");
      }
      for (b._2_2_ = 0; b._2_2_ < this->num_items; b._2_2_ = b._2_2_ + 1) {
        bVar2 = check_item(this,this->items + b._2_2_);
        if (!bVar2) {
          return false;
        }
      }
      this_local._7_1_ = true;
    }
  }
  else {
    this_local._7_1_ = return_error(this,"wrong number bytes to unpack");
  }
  return this_local._7_1_;
}

Assistant:

bool LASzip::unpack(const U8* bytes, const I32 num)
{
  // check input
  if (num < 34) return return_error("too few bytes to unpack");
  if (((num - 34) % 6) != 0) return return_error("wrong number bytes to unpack"); 
  if (((num - 34) / 6) == 0) return return_error("zero items to unpack");
  num_items = (num - 34) / 6;

  // create item list
  if (items) delete [] items;
  items = new LASitem[num_items];

  // do the unpacking
  U16 i;
  const U8* b = bytes;
  compressor = *((const U16*)b);
  b += 2;
  coder = *((const U16*)b);
  b += 2;
  version_major = *((const U8*)b);
  b += 1;
  version_minor = *((const U8*)b);
  b += 1;
  version_revision = *((const U16*)b);
  b += 2;
  options = *((const U32*)b);
  b += 4;
  chunk_size = *((const U32*)b);
  b += 4;
  number_of_special_evlrs = *((const I64*)b);
  b += 8;
  offset_to_special_evlrs = *((const I64*)b);
  b += 8;
  num_items = *((const U16*)b);
  b += 2;
  for (i = 0; i < num_items; i++)
  {
    items[i].type = (LASitem::Type)*((const U16*)b);
    b += 2;
    items[i].size = *((const U16*)b);
    b += 2;
    items[i].version = *((const U16*)b);
    b += 2;
  }
  assert((bytes + num) == b);

  // check if we support the contents

  for (i = 0; i < num_items; i++)
  {
    if (!check_item(&items[i])) return false;
  }
  return true;
}